

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo_commands.cpp
# Opt level: O3

void __thiscall
CommandDrawString::Parse(CommandDrawString *this,FScanner *sc,bool fullScreenOffsets)

{
  bool bVar1;
  EColorRange EVar2;
  FFont *pFVar3;
  
  bVar1 = FScanner::CheckToken(sc,0x102);
  if (!bVar1) {
    FScanner::MustGetToken(sc,0x101);
  }
  pFVar3 = V_GetFont(sc->String);
  this->font = pFVar3;
  if (pFVar3 == (FFont *)0x0) {
    FScanner::ScriptMessage(sc,"Unknown font \'%s\'.",sc->String);
    this->font = SmallFont;
  }
  FScanner::MustGetToken(sc,0x2c);
  EVar2 = SBarInfoCommand::GetTranslation(&this->super_SBarInfoCommand,sc);
  this->translation = EVar2;
  FScanner::MustGetToken(sc,0x2c);
  ParseStringValue(this,sc);
  FScanner::MustGetToken(sc,0x2c);
  SBarInfoCommand::GetCoordinates
            (&this->super_SBarInfoCommand,sc,fullScreenOffsets,&this->startX,&this->y);
  bVar1 = FScanner::CheckToken(sc,0x2c);
  if (bVar1) {
    FScanner::MustGetToken(sc,0x104);
    this->spacing = sc->Number;
    bVar1 = FScanner::CheckToken(sc,0x2c);
    if ((bVar1) && (bVar1 = FScanner::CheckToken(sc,0x101), bVar1)) {
      do {
        bVar1 = FScanner::Compare(sc,"alignment");
        if (bVar1) {
          FScanner::MustGetToken(sc,0x28);
          FScanner::MustGetToken(sc,0x101);
          bVar1 = FScanner::Compare(sc,"right");
          if (bVar1) {
            this->alignment = ALIGN_RIGHT;
          }
          else {
            bVar1 = FScanner::Compare(sc,"left");
            if (bVar1) {
              this->alignment = ALIGN_LEFT;
            }
            else {
              bVar1 = FScanner::Compare(sc,"center");
              if (bVar1) {
                this->alignment = ALIGN_CENTER;
              }
              else {
                FScanner::ScriptError(sc,"Unknown alignment \'%s\'.",sc->String);
              }
            }
          }
          FScanner::MustGetToken(sc,0x29);
        }
        else {
          bVar1 = FScanner::Compare(sc,"drawshadow");
          if (bVar1) {
            bVar1 = FScanner::CheckToken(sc,0x28);
            if (bVar1) {
              FScanner::MustGetToken(sc,0x104);
              this->shadowX = sc->Number;
              FScanner::MustGetToken(sc,0x2c);
              FScanner::MustGetToken(sc,0x104);
              this->shadowY = sc->Number;
              FScanner::MustGetToken(sc,0x29);
            }
            this->shadow = true;
          }
          else {
            bVar1 = FScanner::Compare(sc,"linebreaks");
            if (bVar1) {
              FScanner::MustGetToken(sc,0x28);
              FScanner::MustGetToken(sc,0x104);
              this->breakWidth = sc->Number;
              FScanner::MustGetToken(sc,0x29);
              this->lineBreaks = true;
            }
            else {
              FScanner::ScriptError(sc,"Unknown flag \'%s\'.",sc->String);
            }
          }
        }
        bVar1 = FScanner::CheckToken(sc,0x7c);
      } while (((bVar1) || (bVar1 = FScanner::CheckToken(sc,0x2c), bVar1)) &&
              (bVar1 = FScanner::CheckToken(sc,0x101), bVar1));
    }
  }
  FScanner::MustGetToken(sc,0x3b);
  RealignString(this);
  return;
}

Assistant:

void	Parse(FScanner &sc, bool fullScreenOffsets)
		{
			if(!sc.CheckToken(TK_StringConst))
				sc.MustGetToken(TK_Identifier);
			font = V_GetFont(sc.String);
			if(font == NULL)
			{
				sc.ScriptMessage("Unknown font '%s'.", sc.String);
				font = SmallFont;
			}
			sc.MustGetToken(',');
			translation = GetTranslation(sc);
			sc.MustGetToken(',');
			ParseStringValue(sc);
			sc.MustGetToken(',');
			GetCoordinates(sc, fullScreenOffsets, startX, y);
			if(sc.CheckToken(',')) //spacing
			{
				sc.MustGetToken(TK_IntConst);
				spacing = sc.Number;
				if(sc.CheckToken(',')) //[KS] flags? flags! SIX FLAGS!
				{
					while(sc.CheckToken(TK_Identifier))
					{
						if(sc.Compare("alignment"))
						{
							sc.MustGetToken('(');
							sc.MustGetToken(TK_Identifier);
							if(sc.Compare("right"))
								alignment = ALIGN_RIGHT;
							else if(sc.Compare("left"))
								alignment = ALIGN_LEFT;
							else if(sc.Compare("center"))
								alignment = ALIGN_CENTER;
							else
								sc.ScriptError("Unknown alignment '%s'.", sc.String);
							sc.MustGetToken(')');
						}
						else if(sc.Compare("drawshadow"))
						{
							if(sc.CheckToken('('))
							{
								sc.MustGetToken(TK_IntConst);
								shadowX = sc.Number;
								sc.MustGetToken(',');
								sc.MustGetToken(TK_IntConst);
								shadowY = sc.Number;
								sc.MustGetToken(')');
							}
							shadow = true;
						}
						else if(sc.Compare("linebreaks"))
						{
							sc.MustGetToken('(');
							sc.MustGetToken(TK_IntConst);
							breakWidth = sc.Number;
							sc.MustGetToken(')');
							lineBreaks = true;
						}
						else
							sc.ScriptError("Unknown flag '%s'.", sc.String);
						if(!sc.CheckToken('|') && !sc.CheckToken(',')) break;
					}
				}
			}
			sc.MustGetToken(';');

			RealignString();
		}